

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

bool booster::locale::impl_icu::num_base::use_parent<float>(ios_base *ios,float v)

{
  bool bVar1;
  ios_info *this;
  uint64_t uVar2;
  float in_XMM0_Da;
  uint64_t flg;
  undefined1 local_1;
  
  this = ios_info::get((ios_base *)0x27bf79);
  uVar2 = ios_info::display_flags(this);
  if (uVar2 == 0) {
    local_1 = true;
  }
  else {
    bVar1 = details::use_parent_traits<float,_true,_false,_false>::use(in_XMM0_Da);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool use_parent(std::ios_base &ios,ValueType v)
    {
        uint64_t flg = ios_info::get(ios).display_flags();
        if(flg == flags::posix)
            return true;
        if(details::use_parent_traits<ValueType>::use(v))
            return true;

        if(!std::numeric_limits<ValueType>::is_integer)
            return false;

        if(flg == flags::number && (ios.flags() & std::ios_base::basefield) != std::ios_base::dec) {
            return true;
        }
        return false;
    }